

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Connection::getProcessorInstance(Connection *this,Expression *e)

{
  long lVar1;
  
  do {
    lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ProcessorInstanceRef::typeinfo,0);
    if (lVar1 != 0) {
      (this->super_ASTObject)._vptr_ASTObject = *(_func_int ***)(lVar1 + 0x30);
      return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
    }
    lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ConnectionEndpointRef::typeinfo,0);
    if (lVar1 != 0) {
      if (*(Expression **)(lVar1 + 0x30) == (Expression *)0x0) {
        (this->super_ASTObject)._vptr_ASTObject = (_func_int **)0x0;
      }
      else {
        getProcessorInstance(this,*(Expression **)(lVar1 + 0x30));
      }
      if (lVar1 != 0) {
        return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
      }
    }
    lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ArrayElementRef::typeinfo,0);
    if (lVar1 != 0) {
      if (*(Expression **)(lVar1 + 0x30) == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      getProcessorInstance(this,*(Expression **)(lVar1 + 0x30));
      if (lVar1 != 0) {
        return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
      }
    }
    lVar1 = __dynamic_cast(e,&Expression::typeinfo,&DotOperator::typeinfo,0);
    if (lVar1 == 0) {
      (this->super_ASTObject)._vptr_ASTObject = (_func_int **)0x0;
      return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
    }
    e = *(Expression **)(lVar1 + 0x30);
  } while( true );
}

Assistant:

static pool_ptr<ProcessorInstance> getProcessorInstance (Expression& e)
        {
            if (auto pr = cast<ProcessorInstanceRef> (e))    return pr->processorInstance;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->parentProcessorInstance != nullptr ? getProcessorInstance (*er->parentProcessorInstance) : nullptr;
            if (auto ar = cast<ArrayElementRef> (e))         return getProcessorInstance (*ar->object);
            if (auto dot = cast<DotOperator> (e))            return getProcessorInstance (dot->lhs);

            return {};
        }